

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::splatI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  undefined1 auStack_78 [8];
  LaneArray<4> lanes;
  
  if ((this->type).id == 2) {
    lanes._M_elems[3].field_0.i64 = 0;
    lanes._M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
    lanes._M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
    lanes._M_elems[2].type.id = 0;
    lanes._M_elems[1].type.id = 0;
    lanes._M_elems[2].field_0.i64 = 0;
    lanes._M_elems[1].field_0.i64 = 0;
    lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
    lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
    lanes._M_elems[0].type.id = 0;
    auStack_78 = (undefined1  [8])0x0;
    lanes._M_elems[0].field_0.i64 = 0;
    std::array<wasm::Literal,_4UL>::fill((array<wasm::Literal,_4UL> *)auStack_78,this);
    Literal(__return_storage_ptr__,(LaneArray<4> *)auStack_78);
    std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)auStack_78);
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Ty",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x71a,"Literal wasm::splat(const Literal &) [Ty = wasm::Type::i32, Lanes = 4]");
}

Assistant:

Literal Literal::splatI32x4() const { return splat<Type::i32, 4>(*this); }